

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O0

void __thiscall ON_UserData::ON_UserData(ON_UserData *this)

{
  ON_UserData *this_local;
  
  ON_Object::ON_Object(&this->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b7ac60;
  (this->m_userdata_uuid).Data1 = 0;
  (this->m_userdata_uuid).Data2 = 0;
  (this->m_userdata_uuid).Data3 = 0;
  (this->m_userdata_uuid).Data4[0] = '\0';
  (this->m_userdata_uuid).Data4[1] = '\0';
  (this->m_userdata_uuid).Data4[2] = '\0';
  (this->m_userdata_uuid).Data4[3] = '\0';
  (this->m_userdata_uuid).Data4[4] = '\0';
  (this->m_userdata_uuid).Data4[5] = '\0';
  (this->m_userdata_uuid).Data4[6] = '\0';
  (this->m_userdata_uuid).Data4[7] = '\0';
  (this->m_application_uuid).Data1 = 0;
  (this->m_application_uuid).Data2 = 0;
  (this->m_application_uuid).Data3 = 0;
  (this->m_application_uuid).Data4[0] = '\0';
  (this->m_application_uuid).Data4[1] = '\0';
  (this->m_application_uuid).Data4[2] = '\0';
  (this->m_application_uuid).Data4[3] = '\0';
  (this->m_application_uuid).Data4[4] = '\0';
  (this->m_application_uuid).Data4[5] = '\0';
  (this->m_application_uuid).Data4[6] = '\0';
  (this->m_application_uuid).Data4[7] = '\0';
  this->m_userdata_copycount = 0;
  memcpy(&this->m_userdata_xform,&ON_Xform::IdentityTransformation,0x80);
  this->m_userdata_owner = (ON_Object *)0x0;
  this->m_userdata_next = (ON_UserData *)0x0;
  return;
}

Assistant:

ON_UserData::ON_UserData()
            : m_userdata_uuid(ON_nil_uuid), 
              m_application_uuid(ON_nil_uuid),
              m_userdata_copycount(0),
              m_userdata_xform(ON_Xform::IdentityTransformation),
              m_userdata_owner(0),
              m_userdata_next(0)
{}